

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlReadDoc(xmlChar *cur,char *URL,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input_00;
  undefined8 local_48;
  xmlDocPtr doc;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlChar *cur_local;
  
  local_48 = (xmlDocPtr)0x0;
  ctxt_00 = xmlNewParserCtxt();
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    cur_local = (xmlChar *)0x0;
  }
  else {
    xmlCtxtUseOptions(ctxt_00,options);
    input_00 = xmlCtxtNewInputFromString(ctxt_00,URL,(char *)cur,encoding,2);
    if (input_00 != (xmlParserInputPtr)0x0) {
      local_48 = xmlCtxtParseDocument(ctxt_00,input_00);
    }
    xmlFreeParserCtxt(ctxt_00);
    cur_local = (xmlChar *)local_48;
  }
  return (xmlDocPtr)cur_local;
}

Assistant:

xmlDocPtr
xmlReadDoc(const xmlChar *cur, const char *URL, const char *encoding,
           int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc = NULL;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromString(ctxt, URL, (const char *) cur, encoding,
                                      XML_INPUT_BUF_STATIC);

    if (input != NULL)
        doc = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(doc);
}